

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::erase
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int *key)

{
  int *piVar1;
  bool bVar2;
  int *in_RSI;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RDI;
  int next_key;
  int num_erased;
  int pos;
  bool in_stack_00000115;
  bool in_stack_00000116;
  bool in_stack_00000117;
  double in_stack_00000118;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_00000120;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  byte in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  byte bVar3;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffff90;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this_00;
  byte local_61;
  int local_54;
  int local_50;
  int local_4c;
  
  local_4c = upper_bound<int>(in_stack_ffffffffffffff90,
                              (int *)CONCAT17(in_stack_ffffffffffffff8f,
                                              CONCAT16(in_stack_ffffffffffffff8e,
                                                       CONCAT24(in_stack_ffffffffffffff8c,
                                                                in_stack_ffffffffffffff88))));
  if (local_4c != 0) {
    piVar1 = in_RDI->key_slots_;
    this_00 = in_RDI;
    bVar2 = AlexCompare::operator()(in_RDI->key_less_,piVar1 + (local_4c + -1),in_RSI);
    local_61 = 0;
    if (!bVar2) {
      bVar2 = AlexCompare::operator()(this_00->key_less_,in_RSI,piVar1 + (local_4c + -1));
      local_61 = bVar2 ^ 0xff;
    }
    if ((local_61 & 1) != 0) {
      local_50 = 0;
      if (local_4c == in_RDI->data_capacity_) {
        local_54 = 0x7fffffff;
      }
      else {
        local_54 = in_RDI->key_slots_[local_4c];
      }
      while( true ) {
        local_4c = local_4c + -1;
        bVar3 = 0;
        if (-1 < local_4c) {
          piVar1 = in_RDI->key_slots_;
          bVar2 = AlexCompare::operator()(in_RDI->key_less_,piVar1 + local_4c,in_RSI);
          in_stack_ffffffffffffff8e = 0;
          bVar3 = in_stack_ffffffffffffff8e;
          if (!bVar2) {
            bVar2 = AlexCompare::operator()(in_RDI->key_less_,in_RSI,piVar1 + local_4c);
            in_stack_ffffffffffffff8e = bVar2 ^ 0xff;
            bVar3 = in_stack_ffffffffffffff8e;
          }
        }
        if ((bVar3 & 1) == 0) break;
        in_RDI->key_slots_[local_4c] = local_54;
        bVar2 = check_exists(this_00,CONCAT13(bVar3,CONCAT12(in_stack_ffffffffffffff8e,
                                                             in_stack_ffffffffffffff8c)));
        local_50 = (uint)bVar2 + local_50;
        unset_bit(this_00,CONCAT13(bVar3,CONCAT12(in_stack_ffffffffffffff8e,
                                                  in_stack_ffffffffffffff8c)));
      }
      in_RDI->num_keys_ = in_RDI->num_keys_ - local_50;
      if ((double)in_RDI->num_keys_ < in_RDI->contraction_threshold_) {
        resize(in_stack_00000120,in_stack_00000118,in_stack_00000117,in_stack_00000116,
               in_stack_00000115);
        in_RDI->num_resizes_ = in_RDI->num_resizes_ + 1;
      }
      return local_50;
    }
  }
  return 0;
}

Assistant:

int erase(const T& key) {
    int pos = upper_bound(key);

    if (pos == 0 || !key_equal(ALEX_DATA_NODE_KEY_AT(pos - 1), key)) return 0;

    // Erase preceding positions until we reach a key with smaller value
    int num_erased = 0;
    T next_key;
    if (pos == data_capacity_) {
      next_key = kEndSentinel_;
    } else {
      next_key = ALEX_DATA_NODE_KEY_AT(pos);
    }
    pos--;
    while (pos >= 0 && key_equal(ALEX_DATA_NODE_KEY_AT(pos), key)) {
      ALEX_DATA_NODE_KEY_AT(pos) = next_key;
      num_erased += check_exists(pos);
      unset_bit(pos);
      pos--;
    }

    num_keys_ -= num_erased;

    if (num_keys_ < contraction_threshold_) {
      resize(kMaxDensity_);  // contract
      num_resizes_++;
    }
    return num_erased;
  }